

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec4<int>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  int *piVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec4<int>_> b_1;
  Vec4<int> max;
  Vec4<int> min;
  Box<Imath_3_2::Vec4<int>_> b1;
  int hi;
  int lo;
  uint i;
  Vec4<int> p1;
  Vec4<int> p0;
  Box<Imath_3_2::Vec4<int>_> b0;
  Box<Imath_3_2::Vec4<int>_> b;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Box<Imath_3_2::Vec4<int>_> *in_stack_ffffffffffffff10;
  Box<Imath_3_2::Vec4<int>_> *in_stack_ffffffffffffff18;
  Box<Imath_3_2::Vec4<int>_> *in_stack_ffffffffffffff20;
  Vec4<int> local_d4;
  Vec4<int> local_c4 [3];
  int local_94;
  int local_90;
  uint local_8c;
  Vec4<int> local_88;
  Vec4<int> local_78;
  Vec4<int> local_68;
  Vec4<int> local_58 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::Box
            ((Box<Imath_3_2::Vec4<int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::makeInfinite(in_stack_ffffffffffffff20);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite(in_stack_ffffffffffffff18);
  if (!bVar1) {
    __assert_fail("b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x318,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                 );
  }
  Imath_3_2::Vec4<int>::Vec4(local_58,-1);
  Imath_3_2::Vec4<int>::Vec4(&local_68,1);
  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::Box
            (in_stack_ffffffffffffff10,
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite(in_stack_ffffffffffffff18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x323,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                 );
  }
  Imath_3_2::Vec4<int>::Vec4(&local_78);
  Imath_3_2::Vec4<int>::Vec4(&local_88);
  local_8c = 0;
  while( true ) {
    uVar3 = local_8c;
    uVar2 = Imath_3_2::Vec4<int>::dimensions();
    if (uVar2 <= uVar3) break;
    local_90 = 1 << ((char)local_8c + 1U & 0x1f);
    uVar3 = Imath_3_2::Vec4<int>::dimensions();
    local_94 = 1 << ((char)uVar3 - (char)local_8c & 0x1fU);
    in_stack_ffffffffffffff00 = -local_90;
    piVar5 = Imath_3_2::Vec4<int>::operator[](&local_78,local_8c);
    *piVar5 = in_stack_ffffffffffffff00;
    in_stack_ffffffffffffff04 = local_94;
    piVar5 = Imath_3_2::Vec4<int>::operator[](&local_88,local_8c);
    *piVar5 = in_stack_ffffffffffffff04;
    local_8c = local_8c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::Box
            (in_stack_ffffffffffffff10,(Vec4<int> *)CONCAT44(in_stack_ffffffffffffff0c,uVar3),
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite(in_stack_ffffffffffffff18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x32f,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                 );
  }
  Imath_3_2::Vec4<int>::Vec4(local_c4,0);
  Imath_3_2::Vec4<int>::Vec4(&local_d4,local_c4);
  uVar2 = Imath_3_2::Vec4<int>::dimensions();
  piVar5 = Imath_3_2::Vec4<int>::operator[](&local_d4,uVar2 - 1);
  *piVar5 = 2;
  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::Box
            (in_stack_ffffffffffffff10,(Vec4<int> *)CONCAT44(in_stack_ffffffffffffff0c,uVar3),
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite(in_stack_ffffffffffffff18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x340,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite (const char* type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.isInfinite ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (!b0.isInfinite ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (!b1.isInfinite ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.isInfinite ());
    }
}